

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_pmulhuh_mips(uint64_t fs,uint64_t ft)

{
  long lVar1;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  lVar1 = 0;
  do {
    *(short *)((long)&vs + lVar1 * 2) =
         (short)((uint)*(ushort *)((long)&vt + lVar1 * 2) * (uint)*(ushort *)((long)&vs + lVar1 * 2)
                >> 0x10);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return vs.d;
}

Assistant:

uint64_t helper_pmulhuh(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; ++i) {
        uint32_t r = vs.uh[i] * vt.uh[i];
        vs.uh[i] = r >> 16;
    }
    return vs.d;
}